

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O2

void __thiscall QPDF::addPage(QPDF *this,QPDFObjectHandle *newpage,bool first)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int pos;
  undefined7 in_register_00000011;
  allocator<char> local_aa;
  allocator<char> local_a9;
  undefined1 local_a8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  QPDFObjectHandle local_88;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  string local_58 [32];
  string local_38 [32];
  
  if ((int)CONCAT71(in_register_00000011,first) == 0) {
    p_Var1 = &local_78;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage);
    getRoot((QPDF *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>(local_38,"/Pages",&local_a9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_a8 + 0x10),(string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>(local_58,"/Count",&local_aa);
    QPDFObjectHandle::getKey(&local_88,(string *)(local_a8 + 0x10));
    pos = QPDFObjectHandle::getIntValueAsInt(&local_88);
    insertPage(this,(QPDFObjectHandle *)&local_78,pos);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
    std::__cxx11::string::~string(local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage);
    insertPage(this,(QPDFObjectHandle *)&local_68,0);
    p_Var1 = &local_68;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return;
}

Assistant:

void
QPDF::addPage(QPDFObjectHandle newpage, bool first)
{
    if (first) {
        insertPage(newpage, 0);
    } else {
        insertPage(newpage, getRoot().getKey("/Pages").getKey("/Count").getIntValueAsInt());
    }
}